

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatevulnerability.cpp
# Opt level: O1

void __thiscall ValidateVulnerability::ReadVulnerabilityFile(ValidateVulnerability *this)

{
  Validate *this_00;
  int *piVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *this_01;
  Vulnerability *__k;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  mapped_type *pmVar8;
  const_iterator __position;
  size_t sVar9;
  uint uVar10;
  longlong *plVar11;
  int *piVar12;
  long lVar13;
  OASIS_FLOAT *pOVar14;
  Validate *pVVar15;
  OASIS_FLOAT local_94;
  Validate *local_90;
  int *local_88;
  _Alloc_node local_80;
  int *local_78;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_70;
  _Base_ptr local_68;
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *local_60;
  longlong *local_58;
  Vulnerability *local_50;
  int *local_48;
  OASIS_FLOAT *local_40;
  char *local_38;
  
  local_94 = 0.0;
  ReadFirstVulnerabilityLine(this,&local_94);
  if (this->convertToBin_ == true) {
    (**this->_vptr_ValidateVulnerability)(this);
  }
  this_00 = &this->super_Validate;
  pcVar7 = fgets(this_00->line_,0x1000,_stdin);
  if (pcVar7 != (char *)0x0) {
    plVar11 = &this->initialVulID_;
    local_88 = &(this->v_).intensity_bin_id;
    piVar12 = &(this->v_).damage_bin_id;
    pOVar14 = &(this->v_).probability;
    local_78 = &(this->super_Validate).lineno_;
    local_38 = this->vulIDName_;
    local_50 = &this->v_;
    local_90 = (Validate *)this->prevLine_;
    local_60 = &this->vulIDToIntBinIDs_;
    local_68 = &(this->intensityBinIDs_)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_70 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &this->intensityBinIDs_;
    local_58 = plVar11;
    local_48 = piVar12;
    local_40 = pOVar14;
    do {
      iVar5 = __isoc99_sscanf(this_00,"%lld,%d,%d,%f",plVar11,local_88,piVar12,pOVar14);
      if (iVar5 == 4) {
        uVar6 = Validate::CheckIDDoesNotExceedMaxLimit(this_00,local_38,this->initialVulID_);
        (this->v_).vulnerability_id = uVar6;
        if ((int)uVar6 < this->prevVulID_) {
          uVar2 = (this->super_Validate).lineno_;
          fprintf(_stderr,
                  "ERROR: Vulnerability IDs %d and %d in lines %d and %d respectively are not in ascending order:\n%s\n%s\n"
                  ,(ulong)(uint)this->prevVulID_,(ulong)uVar6,(ulong)(uVar2 - 1),(ulong)uVar2,
                  this_00,local_90);
          Validate::PrintErrorMessage(this_00);
        }
        if (((this->v_).vulnerability_id == this->prevVulID_) &&
           ((this->v_).intensity_bin_id == this->prevIntBinID_)) {
          local_94 = *pOVar14 + local_94;
        }
        else {
          if ((int)(local_94 * 10000.0 + 0.5) != 10000) {
            fprintf(_stderr,
                    "ERROR: Probabilities for vulnerability ID %d and intensity bin ID %d do not sum to 1.0 (total probability = %f).\n"
                    ,(double)local_94,(ulong)(uint)this->prevVulID_,(ulong)(uint)this->prevIntBinID_
                   );
            Validate::PrintErrorMessage(this_00);
          }
          if ((this->v_).vulnerability_id == this->prevVulID_) {
            uVar6 = (this->v_).intensity_bin_id;
            if (uVar6 - 1 != this->prevIntBinID_) {
              uVar2 = (this->super_Validate).lineno_;
              fprintf(_stderr,
                      "ERROR: Non-contiguous intensity bin IDs %d on line %d and %d on line %d:\n%s\n%s\n"
                      ,(ulong)(uint)this->prevIntBinID_,(ulong)(uVar2 - 1),(ulong)uVar6,(ulong)uVar2
                      ,local_90,this_00);
              Validate::PrintErrorMessage(this_00);
            }
          }
          __k = local_50;
          this_01 = local_60;
          if (this->allIntensityBinsCheck_ == true) {
            pmVar8 = std::
                     map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                     ::operator[](local_60,&local_50->vulnerability_id);
            local_80._M_t =
                 &std::
                  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                  ::operator[](this_01,&__k->vulnerability_id)->_M_t;
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique_<int_const&,std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::_Alloc_node>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       local_80._M_t,(const_iterator)&(pmVar8->_M_t)._M_impl.super__Rb_tree_header,
                       local_88,&local_80);
            iVar5 = (this->v_).intensity_bin_id;
            lVar13 = (long)iVar5;
            __position._M_node = local_68;
            if (iVar5 <= (int)(this->intensityBinIDs_)._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count) {
              __position._M_node =
                   (this->intensityBinIDs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              if (iVar5 < 1) {
                if (iVar5 != 0) {
                  do {
                    __position._M_node = (_Base_ptr)std::_Rb_tree_decrement(__position._M_node);
                    lVar13 = lVar13 + 1;
                  } while (lVar13 != 0);
                }
              }
              else {
                do {
                  __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
                  lVar13 = lVar13 + -1;
                } while (lVar13 != 0);
              }
            }
            local_80._M_t =
                 (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 local_70;
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique_<int_const&,std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::_Alloc_node>
                      (local_70,__position,local_88,&local_80);
            plVar11 = local_58;
            piVar12 = local_48;
            pOVar14 = local_40;
          }
          if ((this->useIndexFile_ == true) && ((this->v_).vulnerability_id != this->prevVulID_)) {
            (*this->_vptr_ValidateVulnerability[1])(this);
          }
          this->prevDamageBinID_ = 0;
          local_94 = (this->v_).probability;
        }
        uVar6 = (this->v_).damage_bin_id;
        uVar2 = this->prevDamageBinID_;
        if (uVar6 - 1 != uVar2) {
          if (uVar2 == 0) {
            uVar10 = (this->super_Validate).lineno_;
            uVar3 = (this->v_).intensity_bin_id;
            pcVar7 = 
            "ERROR: First damage bin ID (damage bin ID = %d) on line %d is not 1 for vulnerability ID %d and intensity bin ID %d:\n%s\n"
            ;
            uVar4 = (this->v_).vulnerability_id;
            pVVar15 = this_00;
            uVar2 = uVar6;
          }
          else {
            uVar3 = (this->super_Validate).lineno_;
            uVar10 = uVar3 - 1;
            pcVar7 = 
            "ERROR: Non-contiguous damage bin IDs %d on line %d and %d on line %d:\n%s\n%s\n";
            uVar4 = uVar6;
            pVVar15 = local_90;
          }
          fprintf(_stderr,pcVar7,(ulong)uVar2,(ulong)uVar10,(ulong)uVar4,(ulong)uVar3,pVVar15);
          Validate::PrintErrorMessage(this_00);
        }
        if (this->convertToBin_ == true) {
          (**this->_vptr_ValidateVulnerability)(this);
        }
        piVar1 = &(this->super_Validate).lineno_;
        *piVar1 = *piVar1 + 1;
        iVar5 = (this->v_).intensity_bin_id;
        this->prevVulID_ = (this->v_).vulnerability_id;
        this->prevIntBinID_ = iVar5;
        iVar5 = (this->v_).damage_bin_id;
        this->prevDamageBinID_ = iVar5;
        if (this->maxDamageBin_ < iVar5) {
          this->maxDamageBin_ = iVar5;
        }
        sVar9 = strlen(this_00->line_);
        pVVar15 = local_90;
        memcpy(local_90,this_00,sVar9 + 1);
        sVar9 = strlen(this_00->line_);
        pVVar15->line_[sVar9 - 1] = '\0';
      }
      else {
        ReadVulnerabilityFile();
      }
      pcVar7 = fgets(this_00->line_,0x1000,_stdin);
    } while (pcVar7 != (char *)0x0);
  }
  if ((int)(local_94 * 10000.0 + 0.5) != 10000) {
    ReadVulnerabilityFile();
  }
  if ((this->v_).vulnerability_id == this->prevVulID_) {
    uVar6 = (this->v_).intensity_bin_id;
    uVar2 = this->prevIntBinID_;
    if (uVar6 - 1 != uVar2 && uVar6 != uVar2) {
      uVar10 = (this->super_Validate).lineno_;
      fprintf(_stderr,
              "ERROR: Non-contiguous intensity bin IDs %d on line %d and %d on line %d:\n%s\n%s\n",
              (ulong)uVar2,(ulong)(uVar10 - 1),(ulong)uVar6,(ulong)uVar10,this->prevLine_,this_00);
      Validate::PrintErrorMessage(this_00);
    }
  }
  if (this->useIndexFile_ == true) {
    (*this->_vptr_ValidateVulnerability[1])(this);
  }
  if (this->allIntensityBinsCheck_ == true) {
    CheckAllIntensityBinsPresent(this);
  }
  return;
}

Assistant:

void ValidateVulnerability::ReadVulnerabilityFile() {

  OASIS_FLOAT totalProbability = 0.0;
  ReadFirstVulnerabilityLine(totalProbability);
  // Write first vulnerability line
  if (convertToBin_) WriteBinVulnerabilityFile();

  while (fgets(line_, sizeof(line_), stdin) != 0) {

    if (ScanLine() == 4) {

      CheckVulnerabilityID();

      // New vulnerability and/or intensity bin IDs.
      // Check probabilities sum to 1.0  for each vulnerability ID-intensity
      // bin ID combination and intensity bin IDs are contiguous.
      if ((v_.vulnerability_id != prevVulID_) ||
	  (v_.intensity_bin_id != prevIntBinID_)) {

        CheckProbability(totalProbability);
	if (v_.vulnerability_id == prevVulID_) CheckIntensityBinID();
	if (allIntensityBinsCheck_) SetIntensityBinIDs();
	
	if (useIndexFile_) {
	  if (v_.vulnerability_id != prevVulID_) {

	// if new vulnerability ID then write to index file if requested on
	// command line
	  WriteIdxVulnerabilityFile();

	  }
	}

	// Reset for next vulnerability-intensity bin combination
	prevDamageBinID_ = 0;
	totalProbability = v_.probability;

      } else {   // Only damage bin ID changes

	totalProbability += v_.probability;

      }

      CheckDamageBinID();

      if (convertToBin_) {

        WriteBinVulnerabilityFile();

      }

      StoreLine();
      continue;

    }

    fprintf(stderr, "ERROR: Invalid data in line %d:\n%s\n", lineno_, line_);
    PrintErrorMessage();

  }

  // Check probabilities sum to 1.0 for last vulnerability ID-intensity bin ID
  // combination and intensity bin IDs are contguous.
  CheckProbability(totalProbability);
  if ((v_.vulnerability_id == prevVulID_) &&
      (v_.intensity_bin_id != prevIntBinID_)) CheckIntensityBinID();
  // Write last event to index file if requested on command line
  if (useIndexFile_) WriteIdxVulnerabilityFile();

  if (allIntensityBinsCheck_) CheckAllIntensityBinsPresent();

}